

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O3

void FIX::DateTime::getYMD(int jday,int *year,int *month,int *day)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar1 = (jday * 4 + 0x1f4b3) / 0x23ab1;
  iVar3 = iVar1 * 0x23ab1;
  iVar4 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar4 = iVar3;
  }
  iVar2 = (jday + 0x7d2c) - (iVar4 >> 2);
  iVar4 = (iVar2 * 4 + 3) / 0x5b5;
  iVar5 = iVar4 * 0x5b5;
  iVar3 = iVar5 + 3;
  if (-1 < iVar5) {
    iVar3 = iVar5;
  }
  iVar2 = iVar2 - (iVar3 >> 2);
  iVar3 = iVar2 * 5 + 2;
  iVar5 = iVar2 * 5 + (int)((ulong)((long)iVar3 * -0x29d47f29) >> 0x20) + 2;
  iVar6 = (iVar5 >> 7) - (iVar5 >> 0x1f);
  iVar5 = (int)((ulong)((long)(iVar6 * 0x99 + 2) * -0x66666667) >> 0x20);
  *day = iVar2 + ((iVar5 >> 1) - (iVar5 >> 0x1f)) + 1;
  iVar3 = iVar3 / 0x5fa;
  *month = iVar6 + iVar3 * -0xc + 3;
  *year = iVar1 * 100 + iVar4 + iVar3 + -0x12c0;
  return;
}

Assistant:

static void getYMD(int jday, int &year, int &month, int &day) {
    int a = jday + 32044;
    int b = (4 * a + 3) / 146097;
    int c = a - int((b * 146097) / 4);
    int d = (4 * c + 3) / 1461;
    int e = c - int((1461 * d) / 4);
    int m = (5 * e + 2) / 153;
    day = e - int((153 * m + 2) / 5) + 1;
    month = m + 3 - 12 * int(m / 10);
    year = b * 100 + d - 4800 + int(m / 10);
  }